

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O0

GridMedium *
pbrt::GridMedium::Create
          (ParameterDictionary *parameters,Transform *renderFromMedium,FileLoc *loc,Allocator alloc)

{
  initializer_list<float> v;
  Point3f def;
  span<const_float> v_00;
  span<const_float> v_01;
  span<const_float> v_02;
  span<const_float> v_03;
  Point3<float> p2;
  Point3<float> p1_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  bool bVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  int iVar7;
  size_type sVar8;
  size_type sVar9;
  reference pvVar10;
  GridMedium *pGVar11;
  SampledGrid<float> *in_RCX;
  SampledGrid<float> *in_RDI;
  Float FVar12;
  Float FVar13;
  Float FVar14;
  Float FVar15;
  undefined8 uVar16;
  Point3f PVar17;
  Float temperatureScale;
  Float temperatureOffset;
  Float sigmaScale;
  Spectrum sigma_s;
  Spectrum sigma_a;
  Float g;
  Point3f p1;
  Point3f p0;
  int i;
  vector<float,_std::allocator<float>_> LeScale;
  SampledGrid<float> LeGrid;
  Float LeNorm;
  Spectrum Le;
  optional<pbrt::SampledGrid<float>_> temperatureGrid;
  SampledGrid<float> densityGrid;
  int nz;
  int ny;
  int nx;
  size_t nDensity;
  vector<float,_std::allocator<float>_> temperature;
  vector<float,_std::allocator<float>_> density;
  string *in_stack_fffffffffffff7c8;
  SampledGrid<float> *pSVar18;
  ParameterDictionary *in_stack_fffffffffffff7d0;
  ParameterDictionary *in_stack_fffffffffffff7d8;
  Allocator in_stack_fffffffffffff7e0;
  vector<float,_std::allocator<float>_> *this;
  allocator<char> *in_stack_fffffffffffff800;
  string *in_stack_fffffffffffff808;
  ParameterDictionary *in_stack_fffffffffffff810;
  float *in_stack_fffffffffffff818;
  undefined4 in_stack_fffffffffffff820;
  undefined4 in_stack_fffffffffffff824;
  undefined4 in_stack_fffffffffffff828;
  undefined4 uVar19;
  int in_stack_fffffffffffff82c;
  undefined4 uVar20;
  float in_stack_fffffffffffff830;
  int in_stack_fffffffffffff834;
  Transform *args_1;
  undefined4 in_stack_fffffffffffff838;
  SpectrumType in_stack_fffffffffffff83c;
  Allocator in_stack_fffffffffffff840;
  SampledGrid<float> *this_00;
  string *in_stack_fffffffffffff848;
  ParameterDictionary *in_stack_fffffffffffff850;
  Allocator in_stack_fffffffffffff858;
  Bounds3<float> *this_01;
  undefined7 in_stack_fffffffffffff880;
  SampledGrid<float> *args_6;
  optional<pbrt::SampledGrid<float>_> *args_7;
  ConstantSpectrum *in_stack_fffffffffffff898;
  undefined7 in_stack_fffffffffffff8a0;
  SampledGrid<float> *args_10;
  SampledGrid<float> *args_11;
  undefined4 in_stack_fffffffffffff8b8;
  undefined1 local_5c9 [33];
  Float local_5a8;
  allocator<char> local_5a1;
  string local_5a0 [39];
  allocator<char> local_579;
  string local_578 [32];
  Float local_558;
  undefined1 local_551 [33];
  Float local_530;
  undefined4 local_52c;
  SampledGrid<float> *local_520;
  undefined1 local_509 [33];
  TaggedPointer local_4e8 [12];
  undefined4 local_4dc;
  SampledGrid<float> *local_4d0;
  undefined1 local_4b9 [33];
  TaggedPointer local_498 [15];
  allocator<char> local_489;
  string local_488 [36];
  Float local_464;
  undefined8 local_460;
  float local_458;
  undefined8 local_450;
  undefined4 local_448;
  undefined8 local_440;
  undefined4 local_438;
  allocator<char> local_431;
  string local_430 [32];
  undefined8 local_410;
  float local_408;
  undefined8 local_400;
  float local_3f8;
  undefined8 local_3f0;
  undefined4 local_3e8;
  undefined8 local_3e0;
  undefined4 local_3d8;
  allocator<char> local_3d1;
  string local_3d0 [32];
  undefined8 local_3b0;
  float local_3a8;
  SampledGrid<float> *local_3a0;
  int local_354;
  size_type local_350;
  int local_344;
  SampledGrid<float> *local_340;
  float local_334;
  float *local_330;
  undefined8 local_328;
  allocator<char> local_2d9;
  string local_2d8 [32];
  vector<float,_std::allocator<float>_> local_2b8;
  SampledGrid<float> *local_2a0;
  undefined4 local_25c;
  float local_24c;
  SampledGrid<float> *local_248;
  allocator<char> local_231;
  string local_230 [32];
  TaggedPointer local_210 [8];
  SampledGrid<float> *local_208;
  optional<pbrt::SampledGrid<float>_> local_1c0;
  SampledGrid<float> *local_188;
  int local_140;
  allocator<char> local_139;
  string local_138 [32];
  int local_118;
  allocator<char> local_111;
  string local_110 [32];
  int local_f0;
  allocator<char> local_e9;
  string local_e8 [36];
  int local_c4;
  size_type local_c0;
  size_type local_b8;
  allocator<char> local_a9;
  string local_a8 [32];
  vector<float,_std::allocator<float>_> local_88;
  allocator<char> local_59;
  string local_58 [32];
  vector<float,_std::allocator<float>_> local_38;
  SampledGrid<float> *local_10;
  SampledGrid<float> *local_8;
  
  local_10 = in_RDI;
  local_8 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff810,(char *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
  ParameterDictionary::GetFloatArray(in_stack_fffffffffffff7d8,(string *)in_stack_fffffffffffff7d0);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff810,(char *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
  ParameterDictionary::GetFloatArray(in_stack_fffffffffffff7d8,(string *)in_stack_fffffffffffff7d0);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  bVar4 = std::vector<float,_std::allocator<float>_>::empty
                    ((vector<float,_std::allocator<float>_> *)
                     in_stack_fffffffffffff7e0.memoryResource);
  if (bVar4) {
    ErrorExit((FileLoc *)in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8);
  }
  local_b8 = std::vector<float,_std::allocator<float>_>::size(&local_38);
  bVar4 = std::vector<float,_std::allocator<float>_>::empty
                    ((vector<float,_std::allocator<float>_> *)
                     in_stack_fffffffffffff7e0.memoryResource);
  sVar9 = local_b8;
  if ((!bVar4) &&
     (sVar8 = std::vector<float,_std::allocator<float>_>::size(&local_88), sVar9 != sVar8)) {
    local_c0 = std::vector<float,_std::allocator<float>_>::size(&local_88);
    ErrorExit<unsigned_long&,unsigned_long>
              ((FileLoc *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
               (char *)in_stack_fffffffffffff818,(unsigned_long *)in_stack_fffffffffffff810,
               (unsigned_long *)in_stack_fffffffffffff808);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff810,(char *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
  iVar7 = ParameterDictionary::GetOneInt(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,0);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  local_c4 = iVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff810,(char *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
  iVar7 = ParameterDictionary::GetOneInt(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,0);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  local_f0 = iVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff810,(char *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
  iVar7 = ParameterDictionary::GetOneInt(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,0);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  local_118 = iVar7;
  if (local_b8 != (long)(local_c4 * local_f0 * iVar7)) {
    local_140 = local_c4 * local_f0 * iVar7;
    ErrorExit<unsigned_long&,int>
              ((FileLoc *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
               (char *)in_stack_fffffffffffff818,(unsigned_long *)in_stack_fffffffffffff810,
               (int *)in_stack_fffffffffffff808);
  }
  pstd::span<const_float>::span<float>
            ((span<const_float> *)in_stack_fffffffffffff7e0.memoryResource,
             (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff7d8);
  local_188 = local_8;
  v_00.n = (size_t)in_stack_fffffffffffff850;
  v_00.ptr = (float *)in_stack_fffffffffffff848;
  pSVar18 = local_8;
  SampledGrid<float>::SampledGrid
            ((SampledGrid<float> *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
             v_00,in_stack_fffffffffffff834,(int)in_stack_fffffffffffff830,in_stack_fffffffffffff82c
             ,in_stack_fffffffffffff840);
  pstd::optional<pbrt::SampledGrid<float>_>::optional(&local_1c0);
  sVar9 = std::vector<float,_std::allocator<float>_>::size(&local_88);
  if (sVar9 != 0) {
    pstd::span<const_float>::span<float>
              ((span<const_float> *)in_stack_fffffffffffff7e0.memoryResource,
               (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff7d8);
    local_208 = local_8;
    v_01.n = (size_t)in_stack_fffffffffffff850;
    v_01.ptr = (float *)in_stack_fffffffffffff848;
    pSVar18 = local_8;
    SampledGrid<float>::SampledGrid
              ((SampledGrid<float> *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
               v_01,in_stack_fffffffffffff834,(int)in_stack_fffffffffffff830,
               in_stack_fffffffffffff82c,in_stack_fffffffffffff840);
    pstd::optional<pbrt::SampledGrid<float>_>::operator=
              ((optional<pbrt::SampledGrid<float>_> *)in_stack_fffffffffffff7d0,pSVar18);
    SampledGrid<float>::~SampledGrid((SampledGrid<float> *)0x7b4558);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff810,(char *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
  Spectrum::TaggedPointer((Spectrum *)in_stack_fffffffffffff7d0,pSVar18);
  local_248 = local_8;
  ParameterDictionary::GetOneSpectrum
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,
             (Spectrum *)in_stack_fffffffffffff840.memoryResource,in_stack_fffffffffffff83c,
             in_stack_fffffffffffff858);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  bVar4 = pbrt::TaggedPointer::operator_cast_to_bool(local_210);
  if ((bVar4) &&
     (bVar4 = std::vector<float,_std::allocator<float>_>::empty
                        ((vector<float,_std::allocator<float>_> *)
                         in_stack_fffffffffffff7e0.memoryResource), !bVar4)) {
    ErrorExit((FileLoc *)in_stack_fffffffffffff7d0,(char *)pSVar18);
  }
  local_24c = 1.0;
  bVar4 = pbrt::TaggedPointer::operator_cast_to_bool(local_210);
  if (bVar4) {
    FVar12 = Spectrum::MaxValue((Spectrum *)in_stack_fffffffffffff7d0);
    if ((FVar12 != 0.0) || (NAN(FVar12))) {
      Spectrum::Spectrum((Spectrum *)in_stack_fffffffffffff7d0,(Spectrum *)pSVar18);
      FVar12 = SpectrumToPhotometric((Spectrum *)in_stack_fffffffffffff7e0.memoryResource);
      local_24c = 1.0 / FVar12;
      goto LAB_007b47e0;
    }
  }
  local_25c = 0;
  pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,float>
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff7e0.memoryResource,
             (float *)in_stack_fffffffffffff7d8);
  Spectrum::TaggedPointer<pbrt::ConstantSpectrum>
            ((Spectrum *)in_stack_fffffffffffff7d0,(ConstantSpectrum *)pSVar18);
  Spectrum::operator=((Spectrum *)in_stack_fffffffffffff7d0,(Spectrum *)pSVar18);
LAB_007b47e0:
  local_2a0 = local_8;
  SampledGrid<float>::SampledGrid
            ((SampledGrid<float> *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff810,(char *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
  ParameterDictionary::GetFloatArray(in_stack_fffffffffffff7d8,(string *)in_stack_fffffffffffff7d0);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  bVar4 = std::vector<float,_std::allocator<float>_>::empty
                    ((vector<float,_std::allocator<float>_> *)
                     in_stack_fffffffffffff7e0.memoryResource);
  if (bVar4) {
    local_334 = local_24c;
    local_330 = &local_334;
    local_328 = 1;
    v._M_len = (size_type)in_stack_fffffffffffff7e0.memoryResource;
    v._M_array = (iterator)in_stack_fffffffffffff7d8;
    pstd::span<const_float>::span((span<const_float> *)in_stack_fffffffffffff7d0,v);
    local_340 = local_8;
    v_02.n = (size_t)in_stack_fffffffffffff850;
    v_02.ptr = (float *)in_stack_fffffffffffff848;
    pSVar18 = local_8;
    SampledGrid<float>::SampledGrid
              ((SampledGrid<float> *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
               v_02,in_stack_fffffffffffff834,(int)in_stack_fffffffffffff830,
               in_stack_fffffffffffff82c,in_stack_fffffffffffff840);
    SampledGrid<float>::operator=((SampledGrid<float> *)in_stack_fffffffffffff7d0,pSVar18);
    SampledGrid<float>::~SampledGrid((SampledGrid<float> *)0x7b4953);
  }
  else {
    sVar9 = std::vector<float,_std::allocator<float>_>::size(&local_2b8);
    if (sVar9 != (long)(local_c4 * local_f0 * local_118)) {
      local_344 = local_c4 * local_f0 * local_118;
      local_350 = std::vector<float,_std::allocator<float>_>::size(&local_2b8);
      ErrorExit<int&,int&,int&,int,unsigned_long>
                ((char *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                 (int *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                 (int *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
                 (int *)in_stack_fffffffffffff818,(int *)in_stack_fffffffffffff810,
                 (unsigned_long *)in_stack_fffffffffffff808);
    }
    for (local_354 = 0; fVar3 = local_24c, local_354 < local_c4 * local_f0 * local_118;
        local_354 = local_354 + 1) {
      pvVar10 = std::vector<float,_std::allocator<float>_>::operator[](&local_2b8,(long)local_354);
      *pvVar10 = fVar3 * *pvVar10;
    }
    pstd::span<const_float>::span<float>
              ((span<const_float> *)in_stack_fffffffffffff7e0.memoryResource,
               (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff7d8);
    local_3a0 = local_8;
    v_03.n = (size_t)in_stack_fffffffffffff850;
    v_03.ptr = (float *)in_stack_fffffffffffff848;
    pSVar18 = local_8;
    SampledGrid<float>::SampledGrid
              ((SampledGrid<float> *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
               v_03,in_stack_fffffffffffff834,(int)in_stack_fffffffffffff830,
               in_stack_fffffffffffff82c,in_stack_fffffffffffff840);
    SampledGrid<float>::operator=((SampledGrid<float> *)in_stack_fffffffffffff7d0,pSVar18);
    SampledGrid<float>::~SampledGrid((SampledGrid<float> *)0x7b4b7e);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff810,(char *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffff7d0,(float)((ulong)pSVar18 >> 0x20),
             SUB84(pSVar18,0),0.0);
  local_3e8 = local_3d8;
  local_3f0 = local_3e0;
  uVar16 = 0;
  PVar17.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff82c;
  PVar17.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff828;
  PVar17.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff830;
  PVar17 = ParameterDictionary::GetOnePoint3f
                     (in_stack_fffffffffffff810,in_stack_fffffffffffff808,PVar17);
  local_3f8 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
  auVar2._8_8_ = uVar16;
  auVar2._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  local_400 = vmovlpd_avx(auVar2);
  local_3b0 = local_400;
  local_3a8 = local_3f8;
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff810,(char *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffff7d0,(float)((ulong)pSVar18 >> 0x20),
             SUB84(pSVar18,0),0.0);
  local_448 = local_438;
  local_450 = local_440;
  uVar16 = 0;
  def.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff82c;
  def.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff828;
  def.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff830;
  PVar17 = ParameterDictionary::GetOnePoint3f
                     (in_stack_fffffffffffff810,in_stack_fffffffffffff808,def);
  local_458 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
  auVar1._8_8_ = uVar16;
  auVar1._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  local_460 = vmovlpd_avx(auVar1);
  local_410 = local_460;
  local_408 = local_458;
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator(&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff810,(char *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
  FVar12 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffff7d0,(string *)pSVar18,0.0);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator(&local_489);
  args_11 = (SampledGrid<float> *)local_4b9;
  args_10 = local_10;
  local_464 = FVar12;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff810,(char *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
  Spectrum::TaggedPointer((Spectrum *)in_stack_fffffffffffff7d0,pSVar18);
  local_4d0 = local_8;
  ParameterDictionary::GetOneSpectrum
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,
             (Spectrum *)in_stack_fffffffffffff840.memoryResource,in_stack_fffffffffffff83c,
             in_stack_fffffffffffff858);
  std::__cxx11::string::~string((string *)(local_4b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_4b9);
  uVar5 = pbrt::TaggedPointer::operator_cast_to_bool(local_498);
  if (!(bool)uVar5) {
    local_4dc = 0x3f800000;
    in_stack_fffffffffffff898 =
         pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,float>
                   ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff7e0.memoryResource,
                    (float *)in_stack_fffffffffffff7d8);
    Spectrum::TaggedPointer<pbrt::ConstantSpectrum>
              ((Spectrum *)in_stack_fffffffffffff7d0,(ConstantSpectrum *)pSVar18);
    Spectrum::operator=((Spectrum *)in_stack_fffffffffffff7d0,(Spectrum *)pSVar18);
  }
  args_7 = (optional<pbrt::SampledGrid<float>_> *)local_509;
  args_6 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff810,(char *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
  Spectrum::TaggedPointer((Spectrum *)in_stack_fffffffffffff7d0,pSVar18);
  local_520 = local_8;
  ParameterDictionary::GetOneSpectrum
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,
             (Spectrum *)in_stack_fffffffffffff840.memoryResource,in_stack_fffffffffffff83c,
             in_stack_fffffffffffff858);
  std::__cxx11::string::~string((string *)(local_509 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_509);
  uVar6 = pbrt::TaggedPointer::operator_cast_to_bool(local_4e8);
  if (!(bool)uVar6) {
    local_52c = 0x3f800000;
    pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,float>
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff7e0.memoryResource,
               (float *)in_stack_fffffffffffff7d8);
    Spectrum::TaggedPointer<pbrt::ConstantSpectrum>
              ((Spectrum *)in_stack_fffffffffffff7d0,(ConstantSpectrum *)pSVar18);
    Spectrum::operator=((Spectrum *)in_stack_fffffffffffff7d0,(Spectrum *)pSVar18);
  }
  this_01 = (Bounds3<float> *)local_551;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff810,(char *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
  FVar13 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffff7d0,(string *)pSVar18,0.0);
  std::__cxx11::string::~string((string *)(local_551 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_551);
  local_530 = FVar13;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff810,(char *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
  this_00 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff810,(char *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
  FVar13 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffff7d0,(string *)pSVar18,0.0);
  FVar14 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffff7d0,(string *)pSVar18,0.0);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator(&local_5a1);
  std::__cxx11::string::~string(local_578);
  std::allocator<char>::~allocator(&local_579);
  uVar19 = SUB84(local_10,0);
  uVar20 = (undefined4)((ulong)local_10 >> 0x20);
  args_1 = (Transform *)local_5c9;
  local_558 = FVar14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff810,(char *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
  FVar15 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffff7d0,(string *)pSVar18,0.0);
  std::__cxx11::string::~string((string *)(local_5c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_5c9);
  p1_00.super_Tuple3<pbrt::Point3,_float>.z = SUB84(args_11,0);
  p1_00.super_Tuple3<pbrt::Point3,_float>._0_8_ = args_10;
  p2.super_Tuple3<pbrt::Point3,_float>.z = SUB84(args_7,0);
  p2.super_Tuple3<pbrt::Point3,_float>._0_8_ = args_6;
  local_5a8 = FVar15;
  Bounds3<float>::Bounds3(this_01,p1_00,p2);
  this = (vector<float,_std::allocator<float>_> *)&local_5a8;
  pGVar11 = pstd::pmr::polymorphic_allocator<std::byte>::
            new_object<pbrt::GridMedium,pbrt::Bounds3<float>,pbrt::Transform_const&,pbrt::Spectrum&,pbrt::Spectrum&,float&,float&,pbrt::SampledGrid<float>,pstd::optional<pbrt::SampledGrid<float>>,float&,float&,pbrt::Spectrum&,pbrt::SampledGrid<float>,pstd::pmr::polymorphic_allocator<std::byte>&>
                      ((polymorphic_allocator<std::byte> *)this_00,
                       (Bounds3<float> *)CONCAT44(FVar13,FVar14),args_1,
                       (Spectrum *)CONCAT44(uVar20,uVar19),
                       (Spectrum *)CONCAT44(FVar15,in_stack_fffffffffffff820),
                       in_stack_fffffffffffff818,(float *)CONCAT17(uVar6,in_stack_fffffffffffff880),
                       args_6,args_7,&in_stack_fffffffffffff898->c,
                       (float *)CONCAT17(uVar5,in_stack_fffffffffffff8a0),(Spectrum *)args_10,
                       args_11,(polymorphic_allocator<std::byte> *)
                               CONCAT44(FVar12,in_stack_fffffffffffff8b8));
  std::vector<float,_std::allocator<float>_>::~vector(this);
  SampledGrid<float>::~SampledGrid((SampledGrid<float> *)0x7b55c2);
  pstd::optional<pbrt::SampledGrid<float>_>::~optional
            ((optional<pbrt::SampledGrid<float>_> *)0x7b55cf);
  SampledGrid<float>::~SampledGrid((SampledGrid<float> *)0x7b55dc);
  std::vector<float,_std::allocator<float>_>::~vector(this);
  std::vector<float,_std::allocator<float>_>::~vector(this);
  return pGVar11;
}

Assistant:

GridMedium *GridMedium::Create(const ParameterDictionary &parameters,
                               const Transform &renderFromMedium, const FileLoc *loc,
                               Allocator alloc) {
    std::vector<Float> density = parameters.GetFloatArray("density");
    std::vector<Float> temperature = parameters.GetFloatArray("temperature");

    size_t nDensity;
    if (density.empty())
        ErrorExit(loc, "No \"density\" value provided for grid medium.");
    nDensity = density.size();

    if (!temperature.empty())
        if (nDensity != temperature.size())
            ErrorExit(loc,
                      "Different number of samples (%d vs %d) provided for "
                      "\"density\" and \"temperature\".",
                      nDensity, temperature.size());

    int nx = parameters.GetOneInt("nx", 1);
    int ny = parameters.GetOneInt("ny", 1);
    int nz = parameters.GetOneInt("nz", 1);
    if (nDensity != nx * ny * nz)
        ErrorExit(loc, "Grid medium has %d density values; expected nx*ny*nz = %d",
                  nDensity, nx * ny * nz);

    // Create Density Grid
    SampledGrid<Float> densityGrid = SampledGrid<Float>(density, nx, ny, nz, alloc);

    pstd::optional<SampledGrid<Float>> temperatureGrid;
    if (temperature.size())
        temperatureGrid = SampledGrid<Float>(temperature, nx, ny, nz, alloc);

    Spectrum Le =
        parameters.GetOneSpectrum("Le", nullptr, SpectrumType::Illuminant, alloc);

    if (Le && !temperature.empty())
        ErrorExit(loc, "Both \"Le\" and \"temperature\" values were provided.");

    Float LeNorm = 1;
    if (!Le || Le.MaxValue() == 0)
        Le = alloc.new_object<ConstantSpectrum>(0.f);
    else
        LeNorm = 1 / SpectrumToPhotometric(Le);

    SampledGrid<Float> LeGrid(alloc);
    std::vector<Float> LeScale = parameters.GetFloatArray("Lescale");

    if (LeScale.empty())
        LeGrid = SampledGrid<Float>({LeNorm}, 1, 1, 1, alloc);
    else {
        if (LeScale.size() != nx * ny * nz)
            ErrorExit("Expected %d x %d %d = %d values for \"Lescale\" but were "
                      "given %d.",
                      nx, ny, nz, nx * ny * nz, LeScale.size());
        for (int i = 0; i < nx * ny * nz; ++i)
            LeScale[i] *= LeNorm;
        LeGrid = SampledGrid<Float>(LeScale, nx, ny, nz, alloc);
    }

    Point3f p0 = parameters.GetOnePoint3f("p0", Point3f(0.f, 0.f, 0.f));
    Point3f p1 = parameters.GetOnePoint3f("p1", Point3f(1.f, 1.f, 1.f));

    Float g = parameters.GetOneFloat("g", 0.);
    Spectrum sigma_a =
        parameters.GetOneSpectrum("sigma_a", nullptr, SpectrumType::Unbounded, alloc);
    if (!sigma_a)
        sigma_a = alloc.new_object<ConstantSpectrum>(1.f);
    Spectrum sigma_s =
        parameters.GetOneSpectrum("sigma_s", nullptr, SpectrumType::Unbounded, alloc);
    if (!sigma_s)
        sigma_s = alloc.new_object<ConstantSpectrum>(1.f);
    Float sigmaScale = parameters.GetOneFloat("scale", 1.f);

    Float temperatureOffset = parameters.GetOneFloat("temperatureoffset",
                                                     parameters.GetOneFloat("temperaturecutoff", 0.f));
    Float temperatureScale = parameters.GetOneFloat("temperaturescale", 1.f);

    return alloc.new_object<GridMedium>(
        Bounds3f(p0, p1), renderFromMedium, sigma_a, sigma_s, sigmaScale, g,
        std::move(densityGrid), std::move(temperatureGrid), temperatureScale,
        temperatureOffset, Le, std::move(LeGrid), alloc);
}